

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O2

int ShouldCompress(BrotliTwoPassArena *s,uint8_t *input,size_t input_size,size_t num_literals)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double local_58;
  
  auVar8._8_4_ = (int)(input_size >> 0x20);
  auVar8._0_8_ = input_size;
  auVar8._12_4_ = 0x45300000;
  dVar12 = (auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)input_size) - 4503599627370496.0);
  auVar9._8_4_ = (int)(num_literals >> 0x20);
  auVar9._0_8_ = num_literals;
  auVar9._12_4_ = 0x45300000;
  if ((auVar9._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0) < dVar12 * 0.98) {
    return 1;
  }
  switchD_014c3389::default(s,0,0x400);
  for (uVar3 = 0; uVar3 < input_size; uVar3 = uVar3 + 0x2b) {
    s->lit_histo[input[uVar3]] = s->lit_histo[input[uVar3]] + 1;
  }
  dVar11 = 0.0;
  uVar5 = 0;
  for (uVar3 = 0; uVar3 < 0x400; uVar3 = uVar3 + 8) {
    uVar1 = *(uint *)((long)s->lit_histo + uVar3);
    uVar4 = (ulong)uVar1;
    if (uVar4 < 0x100) {
      dVar6 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar4 * 8);
      local_58 = (double)(int)uVar1;
    }
    else {
      local_58 = (double)uVar4;
      dVar6 = log2(local_58);
    }
    uVar2 = (ulong)*(uint *)((long)s->lit_histo + uVar3 + 4);
    if (uVar2 < 0x100) {
      dVar7 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar2 * 8);
    }
    else {
      dVar7 = log2((double)uVar2);
    }
    uVar5 = uVar5 + uVar4 + uVar2;
    dVar11 = (dVar11 - local_58 * dVar6) - (double)uVar2 * dVar7;
  }
  auVar10._8_4_ = (int)(uVar5 >> 0x20);
  auVar10._0_8_ = uVar5;
  auVar10._12_4_ = 0x45300000;
  dVar6 = (auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
  if (uVar5 != 0) {
    if (uVar5 < 0x100) {
      dVar7 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar5 * 8);
    }
    else {
      dVar7 = log2(dVar6);
    }
    dVar11 = dVar11 + dVar7 * dVar6;
  }
  if (dVar6 <= dVar11) {
    dVar6 = dVar11;
  }
  return (int)(dVar6 < (dVar12 * 8.0 * 0.98) / 43.0);
}

Assistant:

static BROTLI_BOOL ShouldCompress(BrotliTwoPassArena* s,
    const uint8_t* input, size_t input_size, size_t num_literals) {
  double corpus_size = (double)input_size;
  if ((double)num_literals < MIN_RATIO * corpus_size) {
    return BROTLI_TRUE;
  } else {
    const double max_total_bit_cost = corpus_size * 8 * MIN_RATIO / SAMPLE_RATE;
    size_t i;
    memset(s->lit_histo, 0, sizeof(s->lit_histo));
    for (i = 0; i < input_size; i += SAMPLE_RATE) {
      ++s->lit_histo[input[i]];
    }
    return TO_BROTLI_BOOL(BitsEntropy(s->lit_histo, 256) < max_total_bit_cost);
  }
}